

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,
                mrg_parameter<int,_3,_trng::mrg3> *P)

{
  undefined4 uVar1;
  long lVar2;
  char local_2b [3];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_2b[1] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_2b + 1,1);
  lVar2 = 0;
  do {
    std::ostream::operator<<(out,P->a[lVar2]);
    if (lVar2 == 2) break;
    lVar2 = lVar2 + 1;
    local_2b[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_2b,1);
  } while (lVar2 != 3);
  local_2b[2] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_2b + 2,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const mrg_parameter &P) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '(';
      for (int i{0}; i < n; ++i) {
        out << P.a[i];
        if (i + 1 < n)
          out << ' ';
      }
      out << ')';
      out.flags(flags);
      return out;
    }